

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

QStringList *
QtPrivate::QStringList_filter
          (QStringList *__return_storage_ptr__,QStringList *that,QRegularExpression *re)

{
  bool bVar1;
  long lVar2;
  QString *str;
  QString *this;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar2 = (that->d).size;
  if (lVar2 != 0) {
    this = (that->d).ptr;
    lVar2 = lVar2 * 0x18;
    do {
      bVar1 = QString::contains(this,re,(QRegularExpressionMatch *)0x0);
      if (bVar1) {
        QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,this);
        QList<QString>::end(__return_storage_ptr__);
      }
      this = this + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList *that, const QRegularExpression &re)
{
    QStringList res;
    for (const auto &str : *that) {
        if (str.contains(re))
            res.append(str);
    }
    return res;
}